

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.c
# Opt level: O3

void * raviX_calloc(size_t nmemb,size_t size)

{
  void *extraout_RAX;
  void *pvVar1;
  
  pvVar1 = calloc(nmemb,size);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  raviX_calloc_cold_1();
  pvVar1 = realloc((void *)nmemb,size);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  raviX_realloc_cold_1();
  free((void *)nmemb);
  return extraout_RAX;
}

Assistant:

void *raviX_calloc(size_t nmemb, size_t size)
{
	void *ptr;
	ptr = calloc(nmemb, size);
        if (!ptr) {
                fprintf(stderr, "out of memory\n");
                exit(1);
        }
	return ptr;
}